

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pfor2008.h
# Opt level: O2

void __thiscall
FastPForLib::PFor2008::uncompressblockPFOR<unsigned_char>
          (PFor2008 *this,uint32_t *inputbegin,DATATYPE *outputbegin,uint32_t b,uchar **i,
          uchar *end_exception,size_t next_exception)

{
  uint uVar1;
  byte *pbVar2;
  
  unpackblock(this,inputbegin,outputbegin,b);
  pbVar2 = *i;
  while (pbVar2 != end_exception) {
    uVar1 = outputbegin[next_exception];
    *i = pbVar2 + 1;
    outputbegin[next_exception] = (uint)*pbVar2;
    next_exception = next_exception + 1 + (ulong)uVar1;
    pbVar2 = pbVar2 + 1;
  }
  return;
}

Assistant:

void uncompressblockPFOR(
      const uint32_t
          *__restrict__ inputbegin, // points to the first packed word
      DATATYPE *__restrict__ outputbegin,
      const uint32_t b,
      const EXCEPTTYPE *__restrict__
          &i, // i points to value of the first exception
      const EXCEPTTYPE *__restrict__ end_exception,
      size_t next_exception // points to the position of the first exception
      ) {
    unpackblock(inputbegin, reinterpret_cast<uint32_t *>(outputbegin),
                b); /* bit-unpack the values */
    for (size_t cur = next_exception; i != end_exception;
         cur = next_exception) {
      next_exception = cur + static_cast<size_t>(outputbegin[cur]) + 1;
      outputbegin[cur] = *(i++);
    }
  }